

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O0

void __thiscall TPZStream::Write<double>(TPZStream *this,TPZVec<double> *vec)

{
  double *pdVar1;
  ulong uVar2;
  TPZVec<double> *in_RSI;
  long *in_RDI;
  int64_t nel;
  long local_18;
  TPZVec<double> *local_10;
  
  local_10 = in_RSI;
  local_18 = TPZVec<double>::NElements(in_RSI);
  (**(code **)(*in_RDI + 0x28))(in_RDI,&local_18,1);
  if (local_18 != 0) {
    pdVar1 = TPZVec<double>::operator[](local_10,0);
    uVar2 = TPZVec<double>::NElements(local_10);
    (**(code **)(*in_RDI + 0x40))(in_RDI,pdVar1,uVar2 & 0xffffffff);
  }
  return;
}

Assistant:

void Write(const TPZVec<T> &vec) {
      int64_t nel = vec.NElements();
      this->Write(&nel);
      if constexpr(
            std::is_same<std::string, T>::value ||
            is_arithmetic_pz<T>::value){
        if (nel)
          this->Write(&vec[0], vec.NElements());
      }
      else{
          for (auto c = 0; c < nel; c++) {
            vec[c].Write(*this, 0);
        }
      }
    }